

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

void ucnv_SBCSFromUTF8(UConverterFromUnicodeArgs *pFromUArgs,UConverterToUnicodeArgs *pToUArgs,
                      UErrorCode *pErrorCode)

{
  byte bVar1;
  UBool UVar2;
  char cVar3;
  uint8_t *puVar4;
  UChar *local_98;
  UChar *noSource;
  uint8_t b2;
  uint8_t b1;
  int32_t length;
  uint32_t uStack_80;
  UBool hasSupplementary;
  uint16_t minValue;
  uint16_t value;
  uint32_t asciiRoundtrips;
  uint8_t t2;
  uint8_t t1;
  uint8_t b;
  UChar32 c;
  int8_t toULimit;
  int8_t toULength;
  int8_t oldToULength;
  uint16_t *results;
  uint16_t *sbcsIndex;
  uint16_t *table;
  UChar *pUStack_50;
  int32_t targetCapacity;
  uint8_t *target;
  uint8_t *sourceLimit;
  uint8_t *source;
  UConverter *cnv;
  UConverter *utf8;
  UErrorCode *pErrorCode_local;
  UConverterToUnicodeArgs *pToUArgs_local;
  UConverterFromUnicodeArgs *pFromUArgs_local;
  
  cnv = pToUArgs->converter;
  source = (uint8_t *)pFromUArgs->converter;
  sourceLimit = (uint8_t *)pToUArgs->source;
  target = (uint8_t *)pToUArgs->sourceLimit;
  pUStack_50 = (UChar *)pFromUArgs->target;
  table._4_4_ = (int)pFromUArgs->targetLimit - (int)pFromUArgs->target;
  sbcsIndex = (((UConverter *)source)->sharedData->mbcs).fromUnicodeTable;
  results = (((UConverter *)source)->sharedData->mbcs).sbcsIndex;
  if ((((UConverter *)source)->options & 0x10) == 0) {
    _c = (((UConverter *)source)->sharedData->mbcs).fromUnicodeBytes;
  }
  else {
    _c = (((UConverter *)source)->sharedData->mbcs).swapLFNLFromUnicodeBytes;
  }
  uStack_80 = (((UConverter *)source)->sharedData->mbcs).asciiRoundtrips;
  if (((UConverter *)source)->useFallback == '\0') {
    length._0_2_ = 0xc00;
  }
  else {
    length._0_2_ = 0x800;
  }
  b1 = (((UConverter *)source)->sharedData->mbcs).unicodeMask & 1;
  if (cnv->toULength < '\x01') {
    t2 = '\0';
    b = '\0';
    asciiRoundtrips = 0;
  }
  else {
    b = cnv->toULength;
    t2 = (uint8_t)cnv->mode;
    asciiRoundtrips = cnv->toUnicodeStatus;
  }
  noSource._4_4_ = ((int)target - (int)sourceLimit) - ((int)(char)t2 - (int)(char)b);
  if ((0 < noSource._4_4_) && (noSource._3_1_ = target[-1], (noSource._3_1_ & 0x80) != 0)) {
    if (((char)noSource._3_1_ < -0x40) && (1 < noSource._4_4_)) {
      noSource._2_1_ = target[-2];
      if (((0xdf < noSource._2_1_) && (noSource._2_1_ < 0xf0)) &&
         (((int)" 000000000000\x1000"[(int)(noSource._2_1_ & 0xf)] &
          1 << (sbyte)((int)(uint)noSource._3_1_ >> 5)) != 0)) {
        target = target + -2;
      }
    }
    else if ((0xc1 < noSource._3_1_) && (noSource._3_1_ < 0xf0)) {
      target = target + -1;
    }
  }
  t1 = b;
  utf8 = (UConverter *)pErrorCode;
  pErrorCode_local = (UErrorCode *)pToUArgs;
  pToUArgs_local = (UConverterToUnicodeArgs *)pFromUArgs;
  if (asciiRoundtrips == 0) goto LAB_0044d1df;
  if (table._4_4_ < 1) goto LAB_0044d1df;
  cnv->toUnicodeStatus = 0;
  cnv->toULength = '\0';
  do {
    while ((char)t2 <= (char)t1) {
LAB_0044d57f:
      if (t1 != t2) {
        sourceLimit = sourceLimit + -(long)((int)(char)t1 - (int)(char)b);
        while ((char)b < (char)t1) {
          cnv->toUBytes[(char)b] = *sourceLimit;
          b = b + '\x01';
          sourceLimit = sourceLimit + 1;
        }
        cnv->toULength = t1;
        *(uint8_t **)(pErrorCode_local + 4) = sourceLimit;
        pToUArgs_local->target = pUStack_50;
        *(undefined4 *)&utf8->fromUCharErrorBehaviour = 0xc;
        return;
      }
      asciiRoundtrips = asciiRoundtrips - utf8_offsets[(char)t1];
      if ((char)t1 < '\x04') {
        length._2_2_ = *(ushort *)
                        (_c + (long)(int)((uint)sbcsIndex[(int)((uint)sbcsIndex[(int)asciiRoundtrips
                                                                                >> 10] +
                                                               ((int)asciiRoundtrips >> 4 & 0x3fU))]
                                         + (asciiRoundtrips & 0xf)) * 2);
      }
      else if (b1 == '\0') {
        length._2_2_ = 0;
      }
      else {
        length._2_2_ = *(ushort *)
                        (_c + (long)(int)((uint)sbcsIndex[(int)((uint)sbcsIndex[(int)asciiRoundtrips
                                                                                >> 10] +
                                                               ((int)asciiRoundtrips >> 4 & 0x3fU))]
                                         + (asciiRoundtrips & 0xf)) * 2);
      }
LAB_0044d6cd:
      do {
        if (length._2_2_ < (ushort)length) {
          local_98 = L"";
          asciiRoundtrips =
               _extFromU((UConverter *)source,*(UConverterSharedData **)(source + 0x30),
                         asciiRoundtrips,&local_98,L"",(uint8_t **)&stack0xffffffffffffffb0,
                         (byte *)((long)pUStack_50 + (long)table._4_4_),(int32_t **)0x0,-1,
                         pToUArgs_local->flush,(UErrorCode *)utf8);
          UVar2 = U_FAILURE(*(UErrorCode *)&utf8->fromUCharErrorBehaviour);
          if (UVar2 != '\0') {
            *(uint32_t *)(source + 0x54) = asciiRoundtrips;
LAB_0044d7ce:
            UVar2 = U_SUCCESS(*(UErrorCode *)&utf8->fromUCharErrorBehaviour);
            if (((UVar2 != '\0') && (*(int *)(source + 0xd0) < 0)) &&
               (puVar4 = *(uint8_t **)(pErrorCode_local + 6), sourceLimit < puVar4)) {
              bVar1 = *sourceLimit;
              cnv->toUBytes[0] = bVar1;
              asciiRoundtrips = (uint32_t)bVar1;
              t1 = '\x01';
              if ((bVar1 & 0x80) == 0) {
                cVar3 = '\x01';
              }
              else if ((byte)(bVar1 + 0x3e) < 0x33) {
                cVar3 = (0xdf < bVar1) + (0xef < bVar1) + '\x02';
              }
              else {
                cVar3 = '\0';
              }
              while (sourceLimit = sourceLimit + 1, sourceLimit < puVar4) {
                bVar1 = *sourceLimit;
                cnv->toUBytes[(char)t1] = bVar1;
                asciiRoundtrips = asciiRoundtrips * 0x40 + (uint)bVar1;
                t1 = t1 + '\x01';
              }
              cnv->toUnicodeStatus = asciiRoundtrips;
              cnv->toULength = t1;
              cnv->mode = (int)cVar3;
            }
            *(uint8_t **)(pErrorCode_local + 4) = sourceLimit;
            pToUArgs_local->target = pUStack_50;
            return;
          }
          if (-1 < *(int *)(source + 0xd0)) {
            *(undefined4 *)&utf8->fromUCharErrorBehaviour = 0xffffff81;
            goto LAB_0044d7ce;
          }
          table._4_4_ = (int)pToUArgs_local->targetLimit - (int)pUStack_50;
        }
        else {
          *(byte *)pUStack_50 = (byte)length._2_2_;
          table._4_4_ = table._4_4_ + -1;
          pUStack_50 = (UChar *)((long)pUStack_50 + 1);
        }
LAB_0044d1df:
        while( true ) {
          while( true ) {
            while( true ) {
              if (target <= sourceLimit) goto LAB_0044d7ce;
              if (table._4_4_ < 1) {
                *(undefined4 *)&utf8->fromUCharErrorBehaviour = 0xf;
                goto LAB_0044d7ce;
              }
              puVar4 = sourceLimit + 1;
              value._1_1_ = *sourceLimit;
              if ((value._1_1_ & 0x80) != 0) break;
              if ((uStack_80 & 1 << ((byte)((int)(uint)value._1_1_ >> 2) & 0x1f)) == 0) {
                asciiRoundtrips = (uint32_t)value._1_1_;
                length._2_2_ = *(ushort *)(_c + (long)(int)(*results + asciiRoundtrips) * 2);
                sourceLimit = puVar4;
                goto LAB_0044d6cd;
              }
              *(byte *)pUStack_50 = value._1_1_;
              table._4_4_ = table._4_4_ + -1;
              pUStack_50 = (UChar *)((long)pUStack_50 + 1);
              sourceLimit = puVar4;
            }
            if (value._1_1_ < 0xe0) break;
            if (value._1_1_ != 0xe0) {
              asciiRoundtrips = 0xffffffff;
              sourceLimit = puVar4;
              goto LAB_0044d408;
            }
            value._0_1_ = *puVar4 + 0x80;
            if (((0x3f < (byte)value) || ((byte)value < 0x20)) ||
               (minValue._1_1_ = sourceLimit[2] + 0x80, 0x3f < minValue._1_1_)) {
              asciiRoundtrips = 0xffffffff;
              sourceLimit = puVar4;
              goto LAB_0044d408;
            }
            asciiRoundtrips = (uint32_t)(byte)value;
            sourceLimit = sourceLimit + 3;
            length._2_2_ = *(ushort *)
                            (_c + (long)(int)((uint)results[(int)asciiRoundtrips] +
                                             (uint)minValue._1_1_) * 2);
            if (length._2_2_ < (ushort)length) {
              asciiRoundtrips = asciiRoundtrips << 6 | (uint)minValue._1_1_;
              goto LAB_0044d408;
            }
            *(byte *)pUStack_50 = (byte)length._2_2_;
            table._4_4_ = table._4_4_ + -1;
            pUStack_50 = (UChar *)((long)pUStack_50 + 1);
          }
          if ((value._1_1_ < 0xc2) || (value._0_1_ = *puVar4 + 0x80, 0x3f < (byte)value)) {
            asciiRoundtrips = 0xffffffff;
            sourceLimit = puVar4;
            goto LAB_0044d408;
          }
          asciiRoundtrips = value._1_1_ & 0x1f;
          sourceLimit = sourceLimit + 2;
          length._2_2_ = *(ushort *)
                          (_c + (long)(int)((uint)results[(int)asciiRoundtrips] + (uint)(byte)value)
                                * 2);
          if (length._2_2_ < (ushort)length) break;
          *(byte *)pUStack_50 = (byte)length._2_2_;
          table._4_4_ = table._4_4_ + -1;
          pUStack_50 = (UChar *)((long)pUStack_50 + 1);
        }
        asciiRoundtrips = asciiRoundtrips << 6 | (uint)(byte)value;
LAB_0044d408:
      } while (-1 < (int)asciiRoundtrips);
      b = '\0';
      t1 = '\x01';
      if ((byte)(value._1_1_ + 0x3e) < 0x33) {
        t2 = (0xdf < value._1_1_) + (0xef < value._1_1_) + '\x02';
      }
      else {
        t2 = '\0';
      }
      asciiRoundtrips = (uint32_t)value._1_1_;
    }
    if (*(uint8_t **)(pErrorCode_local + 6) <= sourceLimit) {
      sourceLimit = sourceLimit + -(long)((int)(char)t1 - (int)(char)b);
      while ((char)b < (char)t1) {
        cnv->toUBytes[(char)b] = *sourceLimit;
        b = b + '\x01';
        sourceLimit = sourceLimit + 1;
      }
      cnv->toUnicodeStatus = asciiRoundtrips;
      cnv->toULength = t1;
      cnv->mode = (int)(char)t2;
      *(uint8_t **)(pErrorCode_local + 4) = sourceLimit;
      pToUArgs_local->target = pUStack_50;
      return;
    }
    value._1_1_ = *sourceLimit;
    UVar2 = icu_63::UTF8::isValidTrail(asciiRoundtrips,value._1_1_,(int)(char)t1,(int)(char)t2);
    if (UVar2 == '\0') goto LAB_0044d57f;
    sourceLimit = sourceLimit + 1;
    t1 = t1 + '\x01';
    asciiRoundtrips = asciiRoundtrips * 0x40 + (uint)value._1_1_;
  } while( true );
}

Assistant:

static void U_CALLCONV
ucnv_SBCSFromUTF8(UConverterFromUnicodeArgs *pFromUArgs,
                  UConverterToUnicodeArgs *pToUArgs,
                  UErrorCode *pErrorCode) {
    UConverter *utf8, *cnv;
    const uint8_t *source, *sourceLimit;
    uint8_t *target;
    int32_t targetCapacity;

    const uint16_t *table, *sbcsIndex;
    const uint16_t *results;

    int8_t oldToULength, toULength, toULimit;

    UChar32 c;
    uint8_t b, t1, t2;

    uint32_t asciiRoundtrips;
    uint16_t value, minValue = 0;
    UBool hasSupplementary;

    /* set up the local pointers */
    utf8=pToUArgs->converter;
    cnv=pFromUArgs->converter;
    source=(uint8_t *)pToUArgs->source;
    sourceLimit=(uint8_t *)pToUArgs->sourceLimit;
    target=(uint8_t *)pFromUArgs->target;
    targetCapacity=(int32_t)(pFromUArgs->targetLimit-pFromUArgs->target);

    table=cnv->sharedData->mbcs.fromUnicodeTable;
    sbcsIndex=cnv->sharedData->mbcs.sbcsIndex;
    if((cnv->options&UCNV_OPTION_SWAP_LFNL)!=0) {
        results=(uint16_t *)cnv->sharedData->mbcs.swapLFNLFromUnicodeBytes;
    } else {
        results=(uint16_t *)cnv->sharedData->mbcs.fromUnicodeBytes;
    }
    asciiRoundtrips=cnv->sharedData->mbcs.asciiRoundtrips;

    if(cnv->useFallback) {
        /* use all roundtrip and fallback results */
        minValue=0x800;
    } else {
        /* use only roundtrips and fallbacks from private-use characters */
        minValue=0xc00;
    }
    hasSupplementary=(UBool)(cnv->sharedData->mbcs.unicodeMask&UCNV_HAS_SUPPLEMENTARY);

    /* get the converter state from the UTF-8 UConverter */
    if(utf8->toULength > 0) {
        toULength=oldToULength=utf8->toULength;
        toULimit=(int8_t)utf8->mode;
        c=(UChar32)utf8->toUnicodeStatus;
    } else {
        toULength=oldToULength=toULimit=0;
        c = 0;
    }

    // The conversion loop checks source<sourceLimit only once per 1/2/3-byte character.
    // If the buffer ends with a truncated 2- or 3-byte sequence,
    // then we reduce the sourceLimit to before that,
    // and collect the remaining bytes after the conversion loop.
    {
        // Do not go back into the bytes that will be read for finishing a partial
        // sequence from the previous buffer.
        int32_t length=(int32_t)(sourceLimit-source) - (toULimit-oldToULength);
        if(length>0) {
            uint8_t b1=*(sourceLimit-1);
            if(U8_IS_SINGLE(b1)) {
                // common ASCII character
            } else if(U8_IS_TRAIL(b1) && length>=2) {
                uint8_t b2=*(sourceLimit-2);
                if(0xe0<=b2 && b2<0xf0 && U8_IS_VALID_LEAD3_AND_T1(b2, b1)) {
                    // truncated 3-byte sequence
                    sourceLimit-=2;
                }
            } else if(0xc2<=b1 && b1<0xf0) {
                // truncated 2- or 3-byte sequence
                --sourceLimit;
            }
        }
    }

    if(c!=0 && targetCapacity>0) {
        utf8->toUnicodeStatus=0;
        utf8->toULength=0;
        goto moreBytes;
        /*
         * Note: We could avoid the goto by duplicating some of the moreBytes
         * code, but only up to the point of collecting a complete UTF-8
         * sequence; then recurse for the toUBytes[toULength]
         * and then continue with normal conversion.
         *
         * If so, move this code to just after initializing the minimum
         * set of local variables for reading the UTF-8 input
         * (utf8, source, target, limits but not cnv, table, minValue, etc.).
         *
         * Potential advantages:
         * - avoid the goto
         * - oldToULength could become a local variable in just those code blocks
         *   that deal with buffer boundaries
         * - possibly faster if the goto prevents some compiler optimizations
         *   (this would need measuring to confirm)
         * Disadvantage:
         * - code duplication
         */
    }

    /* conversion loop */
    while(source<sourceLimit) {
        if(targetCapacity>0) {
            b=*source++;
            if(U8_IS_SINGLE(b)) {
                /* convert ASCII */
                if(IS_ASCII_ROUNDTRIP(b, asciiRoundtrips)) {
                    *target++=(uint8_t)b;
                    --targetCapacity;
                    continue;
                } else {
                    c=b;
                    value=SBCS_RESULT_FROM_UTF8(sbcsIndex, results, 0, c);
                }
            } else {
                if(b<0xe0) {
                    if( /* handle U+0080..U+07FF inline */
                        b>=0xc2 &&
                        (t1=(uint8_t)(*source-0x80)) <= 0x3f
                    ) {
                        c=b&0x1f;
                        ++source;
                        value=SBCS_RESULT_FROM_UTF8(sbcsIndex, results, c, t1);
                        if(value>=minValue) {
                            *target++=(uint8_t)value;
                            --targetCapacity;
                            continue;
                        } else {
                            c=(c<<6)|t1;
                        }
                    } else {
                        c=-1;
                    }
                } else if(b==0xe0) {
                    if( /* handle U+0800..U+0FFF inline */
                        (t1=(uint8_t)(source[0]-0x80)) <= 0x3f && t1 >= 0x20 &&
                        (t2=(uint8_t)(source[1]-0x80)) <= 0x3f
                    ) {
                        c=t1;
                        source+=2;
                        value=SBCS_RESULT_FROM_UTF8(sbcsIndex, results, c, t2);
                        if(value>=minValue) {
                            *target++=(uint8_t)value;
                            --targetCapacity;
                            continue;
                        } else {
                            c=(c<<6)|t2;
                        }
                    } else {
                        c=-1;
                    }
                } else {
                    c=-1;
                }

                if(c<0) {
                    /* handle "complicated" and error cases, and continuing partial characters */
                    oldToULength=0;
                    toULength=1;
                    toULimit=U8_COUNT_BYTES_NON_ASCII(b);
                    c=b;
moreBytes:
                    while(toULength<toULimit) {
                        /*
                         * The sourceLimit may have been adjusted before the conversion loop
                         * to stop before a truncated sequence.
                         * Here we need to use the real limit in case we have two truncated
                         * sequences at the end.
                         * See ticket #7492.
                         */
                        if(source<(uint8_t *)pToUArgs->sourceLimit) {
                            b=*source;
                            if(icu::UTF8::isValidTrail(c, b, toULength, toULimit)) {
                                ++source;
                                ++toULength;
                                c=(c<<6)+b;
                            } else {
                                break; /* sequence too short, stop with toULength<toULimit */
                            }
                        } else {
                            /* store the partial UTF-8 character, compatible with the regular UTF-8 converter */
                            source-=(toULength-oldToULength);
                            while(oldToULength<toULength) {
                                utf8->toUBytes[oldToULength++]=*source++;
                            }
                            utf8->toUnicodeStatus=c;
                            utf8->toULength=toULength;
                            utf8->mode=toULimit;
                            pToUArgs->source=(char *)source;
                            pFromUArgs->target=(char *)target;
                            return;
                        }
                    }

                    if(toULength==toULimit) {
                        c-=utf8_offsets[toULength];
                        if(toULength<=3) {  /* BMP */
                            value=MBCS_SINGLE_RESULT_FROM_U(table, results, c);
                        } else {
                            /* supplementary code point */
                            if(!hasSupplementary) {
                                /* BMP-only codepages are stored without stage 1 entries for supplementary code points */
                                value=0;
                            } else {
                                value=MBCS_SINGLE_RESULT_FROM_U(table, results, c);
                            }
                        }
                    } else {
                        /* error handling: illegal UTF-8 byte sequence */
                        source-=(toULength-oldToULength);
                        while(oldToULength<toULength) {
                            utf8->toUBytes[oldToULength++]=*source++;
                        }
                        utf8->toULength=toULength;
                        pToUArgs->source=(char *)source;
                        pFromUArgs->target=(char *)target;
                        *pErrorCode=U_ILLEGAL_CHAR_FOUND;
                        return;
                    }
                }
            }

            if(value>=minValue) {
                /* output the mapping for c */
                *target++=(uint8_t)value;
                --targetCapacity;
            } else {
                /* value<minValue means c is unassigned (unmappable) */
                /*
                 * Try an extension mapping.
                 * Pass in no source because we don't have UTF-16 input.
                 * If we have a partial match on c, we will return and revert
                 * to UTF-8->UTF-16->charset conversion.
                 */
                static const UChar nul=0;
                const UChar *noSource=&nul;
                c=_extFromU(cnv, cnv->sharedData,
                            c, &noSource, noSource,
                            &target, target+targetCapacity,
                            NULL, -1,
                            pFromUArgs->flush,
                            pErrorCode);

                if(U_FAILURE(*pErrorCode)) {
                    /* not mappable or buffer overflow */
                    cnv->fromUChar32=c;
                    break;
                } else if(cnv->preFromUFirstCP>=0) {
                    /*
                     * Partial match, return and revert to pivoting.
                     * In normal from-UTF-16 conversion, we would just continue
                     * but then exit the loop because the extension match would
                     * have consumed the source.
                     */
                    *pErrorCode=U_USING_DEFAULT_WARNING;
                    break;
                } else {
                    /* a mapping was written to the target, continue */

                    /* recalculate the targetCapacity after an extension mapping */
                    targetCapacity=(int32_t)(pFromUArgs->targetLimit-(char *)target);
                }
            }
        } else {
            /* target is full */
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    /*
     * The sourceLimit may have been adjusted before the conversion loop
     * to stop before a truncated sequence.
     * If so, then collect the truncated sequence now.
     */
    if(U_SUCCESS(*pErrorCode) &&
            cnv->preFromUFirstCP<0 &&
            source<(sourceLimit=(uint8_t *)pToUArgs->sourceLimit)) {
        c=utf8->toUBytes[0]=b=*source++;
        toULength=1;
        toULimit=U8_COUNT_BYTES(b);
        while(source<sourceLimit) {
            utf8->toUBytes[toULength++]=b=*source++;
            c=(c<<6)+b;
        }
        utf8->toUnicodeStatus=c;
        utf8->toULength=toULength;
        utf8->mode=toULimit;
    }

    /* write back the updated pointers */
    pToUArgs->source=(char *)source;
    pFromUArgs->target=(char *)target;
}